

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < *(int *)((long)field + 8); lVar2 = lVar2 + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    lVar1 = *(long *)((long)field + 0x10) + 8;
    if (*(long *)((long)field + 0x10) == 0) {
      lVar1 = 0;
    }
    OutputHelper<google::protobuf::internal::ArrayOutput,_9>::Serialize
              (*(void **)(lVar1 + lVar2 * 8),output);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<WireFormatLite::TYPE_STRING>(AccessorHelper::Get(array, i),
                                               output);
    }
  }